

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O2

void __thiscall
r_exec::AutoFocusController::dispatch
          (AutoFocusController *this,View *input,_Fact *abstract_input,BindingMap *bm,bool *injected
          ,TPXMap *map)

{
  char cVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(map->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    cVar1 = (*(code *)(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)->_M_nxt[2].
                      _M_nxt)(*(_Hash_node_base **)
                               &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor,input,
                              abstract_input,bm);
    if ((cVar1 != '\0') && (*injected == false)) {
      *injected = true;
      inject_input(this,input,abstract_input,bm);
    }
  }
  return;
}

Assistant:

inline void AutoFocusController::dispatch(View *input, _Fact *abstract_input, BindingMap *bm, bool &injected, TPXMap &map)
{
    TPXMap::const_iterator m;

    for (m = map.begin(); m != map.end(); ++m) {
        if (m->second->take_input(input, abstract_input, bm)) {
            if (!injected) {
                injected = true;
                inject_input(input, abstract_input, bm);
            }
        }
    }
}